

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O3

dynamic_string * __thiscall crnlib::dynamic_string::trim(dynamic_string *this)

{
  ushort uVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  dynamic_string *pdVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint start;
  ulong uVar9;
  ulong uVar10;
  
  uVar1 = this->m_len;
  uVar7 = (ulong)uVar1;
  pcVar2 = this->m_pStr;
  if (uVar1 == 0) {
    uVar10 = 0;
  }
  else {
    uVar9 = 0;
    do {
      iVar3 = isspace((int)pcVar2[uVar9]);
      uVar10 = uVar9;
      if (iVar3 == 0) break;
      uVar9 = uVar9 + 1;
      uVar10 = uVar7;
    } while (uVar7 != uVar9);
  }
  start = (uint)uVar10;
  uVar6 = uVar1 - 1;
  if ((int)start < (int)(uVar1 - 1)) {
    uVar6 = start;
  }
  iVar3 = uVar6 + 1;
  lVar8 = uVar7 - 1;
  do {
    if (lVar8 <= (int)start) goto LAB_00117407;
    iVar4 = isspace((int)pcVar2[lVar8]);
    lVar8 = lVar8 + -1;
  } while (iVar4 != 0);
  iVar3 = (int)lVar8 + 2;
LAB_00117407:
  pdVar5 = crop(this,start,iVar3 - start);
  return pdVar5;
}

Assistant:

dynamic_string& dynamic_string::trim()
    {
        int s, e;
        for (s = 0; s < (int)m_len; s++)
        {
            if (!isspace(m_pStr[s]))
            {
                break;
            }
        }

        for (e = m_len - 1; e > s; e--)
        {
            if (!isspace(m_pStr[e]))
            {
                break;
            }
        }

        return crop(s, e - s + 1);
    }